

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

DOMAttrMapImpl * __thiscall
xercesc_4_0::DOMAttrMapImpl::cloneAttrMap(DOMAttrMapImpl *this,DOMNode *ownerNode_p)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  DOMNodeImpl *this_00;
  DOMDocument *pDVar4;
  undefined4 extraout_var;
  DOMAttrMapImpl *this_01;
  DOMException *this_02;
  
  if (ownerNode_p == (DOMNode *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(ownerNode_p,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
    if (lVar3 != 0) {
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar2 + 0x10))(plVar2);
      pDVar4 = DOMNodeImpl::getOwnerDocument(this_00);
      iVar1 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x26])
                        (&pDVar4->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      this_01 = (DOMAttrMapImpl *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
                          ((long *)CONCAT44(extraout_var,iVar1),0x20);
      DOMAttrMapImpl(this_01,ownerNode_p);
      (*(this_01->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])(this_01,this);
      return this_01;
    }
  }
  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMAttrMapImpl *DOMAttrMapImpl::cloneAttrMap(DOMNode *ownerNode_p)
{
	DOMAttrMapImpl *newmap = new (castToNodeImpl(ownerNode_p)->getOwnerDocument()) DOMAttrMapImpl(ownerNode_p);
	newmap->cloneContent(this);
	// newmap->attrDefaults = this->attrDefaults;  // revisit
	return newmap;
}